

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O2

ST2052_TextParser * __thiscall
AS_02::TimedText::ST2052_TextParser::OpenRead(ST2052_TextParser *this,string *filename)

{
  h__TextParser *this_00;
  
  this_00 = (h__TextParser *)operator_new(400);
  h__TextParser::h__TextParser(this_00);
  ASDCP::mem_ptr<AS_02::TimedText::ST2052_TextParser::h__TextParser>::set
            ((mem_ptr<AS_02::TimedText::ST2052_TextParser::h__TextParser> *)
             &filename->_M_string_length,this_00);
  h__TextParser::OpenRead((h__TextParser *)this,(string *)filename->_M_string_length);
  if (*(int *)&this->_vptr_ST2052_TextParser < 0) {
    ASDCP::mem_ptr<AS_02::TimedText::ST2052_TextParser::h__TextParser>::set
              ((mem_ptr<AS_02::TimedText::ST2052_TextParser::h__TextParser> *)
               &filename->_M_string_length,(h__TextParser *)0x0);
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::ST2052_TextParser::OpenRead(const std::string& filename) const
{
  const_cast<AS_02::TimedText::ST2052_TextParser*>(this)->m_Parser = new h__TextParser;

  Result_t result = m_Parser->OpenRead(filename);

  if ( ASDCP_FAILURE(result) )
    const_cast<AS_02::TimedText::ST2052_TextParser*>(this)->m_Parser = 0;

  return result;
}